

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O3

Object * __thiscall ScriptBlock::execute(ScriptBlock *this,Engine *engine)

{
  LocalFunction *this_00;
  uint localFunctionName;
  ulong uVar1;
  
  if ((this->isRoot == true) && (this->functionsCount != 0)) {
    uVar1 = 0;
    do {
      this_00 = this->functions[uVar1];
      localFunctionName = LocalFunction::getName(this_00);
      Engine::setLocalFunction(engine,localFunctionName,this_00);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->functionsCount);
  }
  if (this->commandsCount != 0) {
    uVar1 = 0;
    do {
      executeVoid(this->commands[uVar1],engine);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->commandsCount);
  }
  return (Object *)0x0;
}

Assistant:

Object *ScriptBlock::execute(Engine *engine) {
	unsigned int i;
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			LocalFunction* function = this->functions[i];
			engine->setLocalFunction(function->getName(), function);
		}
	}
	
	for (i = 0; i < this->commandsCount; i++) {
		executeVoid(this->commands[i], engine);
	}
	return nullptr;
}